

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderBuiltinConstantTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::ShaderBuiltinConstantCase<int>::~ShaderBuiltinConstantCase
          (ShaderBuiltinConstantCase<int> *this)

{
  ~ShaderBuiltinConstantCase(this);
  operator_delete(this,0xc0);
  return;
}

Assistant:

ShaderBuiltinConstantCase<DataType>::~ShaderBuiltinConstantCase (void)
{
}